

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint32_t helper_neon_qabs_s32_aarch64(CPUARMState_conflict *env,uint32_t x)

{
  if ((int)x < 1) {
    x = -x;
  }
  return x;
}

Assistant:

uint32_t HELPER(neon_qabs_s32)(CPUARMState *env, uint32_t x)
{
    if (x == SIGNBIT) {
        SET_QC();
        x = ~SIGNBIT;
    } else if ((int32_t)x < 0) {
#ifdef _MSC_VER
        x = 0 - x;
#else
        x = -x;
#endif
    }
    return x;
}